

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_lextree.c
# Opt level: O0

void fsg_glist_linklist_free(fsg_glist_linklist_t *glist)

{
  fsg_glist_linklist_t *local_18;
  fsg_glist_linklist_t *nxtglist;
  fsg_glist_linklist_t *glist_local;
  
  if (glist != (fsg_glist_linklist_t *)0x0) {
    if (glist->glist != (glist_t)0x0) {
      glist_free(glist->glist);
    }
    nxtglist = glist;
    for (local_18 = glist->next; local_18 != (fsg_glist_linklist_t *)0x0; local_18 = local_18->next)
    {
      ckd_free(nxtglist);
      nxtglist = local_18;
      if (local_18->glist != (glist_t)0x0) {
        glist_free(local_18->glist);
      }
    }
    ckd_free(nxtglist);
  }
  return;
}

Assistant:

void fsg_glist_linklist_free(fsg_glist_linklist_t *glist)
{
    if (glist) {
        fsg_glist_linklist_t *nxtglist;
        if (glist->glist)
            glist_free(glist->glist);
        nxtglist = glist->next;
        while (nxtglist) {
            ckd_free(glist);
            glist = nxtglist;
            if (glist->glist)
                glist_free(glist->glist);
            nxtglist = glist->next;
        }
        ckd_free(glist);
    }
    return;
}